

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O2

string * __thiscall
glcts::(anonymous_namespace)::BasicDispatchIndirect::Purpose_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  allocator<char> local_9;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "\n1. Verify that DispatchComputeIndirect command works as described in the OpenGL specification.\n2. Verify that <offset> parameter is correctly applied.\n3. Verify that updating dispatch buffer with different methods (BufferData, BufferSubData, MapBuffer)\n    just before DispatchComputeIndirect call works as expected.\n4. Verify that GL_DISPATCH_INDIRECT_BUFFER_BINDING binding point is set correctly."
             ,&local_9);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string Purpose()
	{
		return NL
			"1. Verify that DispatchComputeIndirect command works as described in the OpenGL specification." NL
			"2. Verify that <offset> parameter is correctly applied." NL
			"3. Verify that updating dispatch buffer with different methods (BufferData, BufferSubData, MapBuffer)" NL
			"    just before DispatchComputeIndirect call works as expected." NL
			"4. Verify that GL_DISPATCH_INDIRECT_BUFFER_BINDING binding point is set correctly.";
	}